

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.cpp
# Opt level: O2

bool duckdb::StringToNestedTypeCast<duckdb::VectorStringToArray>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  string_t *source_data;
  bool bVar1;
  UnifiedVectorFormat unified_source;
  
  if (source->vector_type == CONSTANT_VECTOR) {
    source_data = (string_t *)source->data;
    FlatVector::VerifyFlatVector(result);
    bVar1 = VectorStringToArray::StringToNestedTypeCastLoop
                      (source_data,&source->validity,result,&result->validity,1,parameters,
                       (SelectionVector *)0x0);
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&unified_source);
    Vector::ToUnifiedFormat(source,count,&unified_source);
    FlatVector::VerifyFlatVector(result);
    bVar1 = VectorStringToArray::StringToNestedTypeCastLoop
                      ((string_t *)unified_source.data,&unified_source.validity,result,
                       &result->validity,count,parameters,unified_source.sel);
    UnifiedVectorFormat::~UnifiedVectorFormat(&unified_source);
  }
  return bVar1;
}

Assistant:

bool StringToNestedTypeCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	D_ASSERT(source.GetType().id() == LogicalTypeId::VARCHAR);

	switch (source.GetVectorType()) {
	case VectorType::CONSTANT_VECTOR: {
		auto source_data = ConstantVector::GetData<string_t>(source);
		auto &source_mask = ConstantVector::Validity(source);
		auto &result_mask = FlatVector::Validity(result);
		auto ret = T::StringToNestedTypeCastLoop(source_data, source_mask, result, result_mask, 1, parameters, nullptr);
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		return ret;
	}
	default: {
		UnifiedVectorFormat unified_source;

		source.ToUnifiedFormat(count, unified_source);
		auto source_sel = unified_source.sel;
		auto source_data = UnifiedVectorFormat::GetData<string_t>(unified_source);
		auto &source_mask = unified_source.validity;
		auto &result_mask = FlatVector::Validity(result);

		return T::StringToNestedTypeCastLoop(source_data, source_mask, result, result_mask, count, parameters,
		                                     source_sel);
	}
	}
}